

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseNameAndCompare(xmlParserCtxtPtr ctxt,xmlChar *other)

{
  byte *pbVar1;
  xmlParserInputPtr pxVar2;
  byte *pbVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  byte *pbVar6;
  byte bVar7;
  byte *pbVar8;
  byte bVar9;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->instate == XML_PARSER_EOF) {
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    pxVar2 = ctxt->input;
    pbVar3 = pxVar2->cur;
    bVar7 = *pbVar3;
    pbVar6 = pbVar3;
    pbVar8 = other;
    while (bVar7 != 0) {
      bVar9 = *pbVar8;
      if (bVar7 != bVar9) goto LAB_0016c38e;
      pbVar8 = pbVar8 + 1;
      pbVar1 = pbVar6 + 1;
      pbVar6 = pbVar6 + 1;
      bVar7 = *pbVar1;
    }
    bVar9 = *pbVar8;
    bVar7 = 0;
LAB_0016c38e:
    if (((bVar9 == 0) && (bVar7 < 0x3f)) &&
       ((0x4000000100002600U >> ((ulong)bVar7 & 0x3f) & 1) != 0)) {
      pxVar2->col = pxVar2->col + ((int)pbVar6 - (int)pbVar3);
      pxVar2->cur = pbVar6;
      pxVar5 = &DAT_00000001;
    }
    else {
      pxVar4 = xmlParseName(ctxt);
      pxVar5 = &DAT_00000001;
      if (pxVar4 != other) {
        pxVar5 = pxVar4;
      }
    }
  }
  return pxVar5;
}

Assistant:

static const xmlChar *
xmlParseNameAndCompare(xmlParserCtxtPtr ctxt, xmlChar const *other) {
    register const xmlChar *cmp = other;
    register const xmlChar *in;
    const xmlChar *ret;

    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        return(NULL);

    in = ctxt->input->cur;
    while (*in != 0 && *in == *cmp) {
	++in;
	++cmp;
    }
    if (*cmp == 0 && (*in == '>' || IS_BLANK_CH (*in))) {
	/* success */
	ctxt->input->col += in - ctxt->input->cur;
	ctxt->input->cur = in;
	return (const xmlChar*) 1;
    }
    /* failure (or end of input buffer), check with full function */
    ret = xmlParseName (ctxt);
    /* strings coming from the dictionary direct compare possible */
    if (ret == other) {
	return (const xmlChar*) 1;
    }
    return ret;
}